

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

void duckdb::ConstantVector::SetNull(Vector *vector,bool is_null)

{
  byte is_null_00;
  PhysicalType PVar1;
  bool bVar2;
  VectorType VVar3;
  LogicalType *this;
  Vector *pVVar4;
  iterator iVar5;
  idx_t iVar6;
  byte in_SIL;
  Vector *in_RDI;
  Vector *unaff_retaddr;
  idx_t i;
  idx_t array_size;
  Vector *child;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *entry;
  iterator __end3;
  iterator __begin3;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *__range3;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *entries;
  PhysicalType internal_type;
  LogicalType *type;
  Vector *in_stack_ffffffffffffff98;
  LogicalType *in_stack_ffffffffffffffa0;
  ulong uVar7;
  idx_t in_stack_ffffffffffffffa8;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffb0;
  undefined1 is_null_01;
  undefined7 in_stack_fffffffffffffff0;
  
  is_null_00 = in_SIL & 1;
  TemplatedValidityMask<unsigned_long>::Set
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             SUB81((ulong)in_stack_ffffffffffffffa0 >> 0x38,0));
  if ((is_null_00 & 1) != 0) {
    this = Vector::GetType(in_RDI);
    PVar1 = LogicalType::InternalType(this);
    is_null_01 = (undefined1)((ulong)this >> 0x38);
    if (PVar1 == STRUCT) {
      pVVar4 = (Vector *)StructVector::GetEntries(in_stack_ffffffffffffff98);
      iVar5 = ::std::
              vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ::begin((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                       *)in_stack_ffffffffffffff98);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ::end((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
             *)in_stack_ffffffffffffff98);
      while (bVar2 = __gnu_cxx::
                     operator!=<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
                               ((__normal_iterator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
                                 *)in_stack_ffffffffffffffa0,
                                (__normal_iterator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
                                 *)in_stack_ffffffffffffff98), bVar2) {
        __gnu_cxx::
        __normal_iterator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
        ::operator*((__normal_iterator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
                     *)&stack0xffffffffffffffc8);
        unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                  ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                   in_stack_ffffffffffffffa0);
        Vector::SetVectorType(pVVar4,(VectorType)((ulong)iVar5._M_current >> 0x38));
        unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                  ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                   in_stack_ffffffffffffffa0);
        SetNull((Vector *)CONCAT17(is_null_00,in_stack_fffffffffffffff0),
                SUB81((ulong)this >> 0x38,0));
        __gnu_cxx::
        __normal_iterator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
        ::operator++((__normal_iterator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
                      *)&stack0xffffffffffffffc8);
      }
    }
    else if (PVar1 == ARRAY) {
      pVVar4 = ArrayVector::GetEntry((Vector *)0x2bd25d8);
      iVar6 = ArrayType::GetSize(in_stack_ffffffffffffffa0);
      VVar3 = Vector::GetVectorType(pVVar4);
      if (VVar3 == CONSTANT_VECTOR) {
        SetNull((Vector *)CONCAT17(is_null_00,in_stack_fffffffffffffff0),(bool)is_null_01);
      }
      else {
        for (uVar7 = 0; uVar7 < iVar6; uVar7 = uVar7 + 1) {
          FlatVector::SetNull(unaff_retaddr,(idx_t)in_RDI,(bool)is_null_00);
        }
      }
    }
  }
  return;
}

Assistant:

void ConstantVector::SetNull(Vector &vector, bool is_null) {
	D_ASSERT(vector.GetVectorType() == VectorType::CONSTANT_VECTOR);
	vector.validity.Set(0, !is_null);
	if (is_null) {
		auto &type = vector.GetType();
		auto internal_type = type.InternalType();
		if (internal_type == PhysicalType::STRUCT) {
			// set all child entries to null as well
			auto &entries = StructVector::GetEntries(vector);
			for (auto &entry : entries) {
				entry->SetVectorType(VectorType::CONSTANT_VECTOR);
				ConstantVector::SetNull(*entry, is_null);
			}
		} else if (internal_type == PhysicalType::ARRAY) {
			auto &child = ArrayVector::GetEntry(vector);
			D_ASSERT(child.GetVectorType() == VectorType::CONSTANT_VECTOR ||
			         child.GetVectorType() == VectorType::FLAT_VECTOR);
			auto array_size = ArrayType::GetSize(type);
			if (child.GetVectorType() == VectorType::CONSTANT_VECTOR) {
				D_ASSERT(array_size == 1);
				ConstantVector::SetNull(child, is_null);
			} else {
				for (idx_t i = 0; i < array_size; i++) {
					FlatVector::SetNull(child, i, is_null);
				}
			}
		}
	}
}